

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool __thiscall Args::details::isMisspelledName(details *this,String *misspelled,String *correct)

{
  long lVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  bool bVar6;
  String cs;
  String ms;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  if ((misspelled == (String *)0x0) || (correct->_M_string_length == 0)) {
    return false;
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,this,this + (long)&misspelled->_M_dataplus);
  pcVar2 = (correct->_M_dataplus)._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + correct->_M_string_length);
  plVar5 = local_40;
  if (local_38 != 0) {
    lVar1 = (long)local_40 + local_38;
    lVar3 = 0x3f;
    if (local_38 != 0) {
      for (; local_38 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_40,lVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar5,lVar1);
  }
  plVar5 = local_60;
  if (local_58 == 0) {
    if (local_38 == 0) {
      bVar6 = true;
      goto LAB_0011a772;
    }
  }
  else {
    lVar1 = (long)local_60 + local_58;
    lVar3 = 0x3f;
    if (local_58 != 0) {
      for (; local_58 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_60,lVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar5,lVar1);
    plVar5 = local_60;
    if (local_38 == local_58) {
      if (local_58 == 0) {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp(local_40,local_60,local_58);
        bVar6 = iVar4 == 0;
      }
      goto LAB_0011a772;
    }
  }
  bVar6 = false;
  plVar5 = local_60;
LAB_0011a772:
  if (plVar5 != local_50) {
    operator_delete(plVar5,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return bVar6;
}

Assistant:

static inline bool
isMisspelledName( const String & misspelled,
	const String & correct )
{
	if( !misspelled.empty() && !correct.empty() )
	{
		String ms = misspelled;
		String cs = correct;

		std::sort( ms.begin(), ms.end() );
		std::sort( cs.begin(), cs.end() );

		return ( ms == cs );
	}
	else
		return false;
}